

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_iface_ips.c
# Opt level: O3

ares_iface_ip_flags_t ares_iface_ips_get_flags(ares_iface_ips_t *ips,size_t idx)

{
  void *pvVar1;
  ares_iface_ip_flags_t aVar2;
  
  aVar2 = 0;
  if (ips != (ares_iface_ips_t *)0x0) {
    pvVar1 = ares_array_at_const(ips->ips,idx);
    aVar2 = 0;
    if (pvVar1 != (void *)0x0) {
      aVar2 = *(ares_iface_ip_flags_t *)((long)pvVar1 + 0x24);
    }
  }
  return aVar2;
}

Assistant:

ares_iface_ip_flags_t ares_iface_ips_get_flags(const ares_iface_ips_t *ips,
                                               size_t                  idx)
{
  const ares_iface_ip_t *ip;

  if (ips == NULL) {
    return 0;
  }

  ip = ares_array_at_const(ips->ips, idx);
  if (ip == NULL) {
    return 0;
  }

  return ip->flags;
}